

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::AbstractDOMParser::endEntityReference(AbstractDOMParser *this,XMLEntityDecl *param_1)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DOMNode *local_20;
  DOMEntityReferenceImpl *erImpl;
  XMLEntityDecl *param_1_local;
  AbstractDOMParser *this_local;
  
  if ((this->fCreateEntityReferenceNodes & 1U) != 0) {
    local_20 = (DOMNode *)0x0;
    iVar1 = (*this->fCurrentParent->_vptr_DOMNode[4])();
    if (iVar1 == 5) {
      local_20 = this->fCurrentParent;
    }
    this->fCurrentNode = this->fCurrentParent;
    iVar1 = (*this->fCurrentNode->_vptr_DOMNode[5])();
    this->fCurrentParent = (DOMNode *)CONCAT44(extraout_var,iVar1);
    if ((this->fCurrentParent == (DOMNode *)0x0) && (this->fDocument != (DOMDocumentImpl *)0x0)) {
      iVar1 = (*(this->fDocument->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x40])();
      this->fCurrentNode = (DOMNode *)CONCAT44(extraout_var_00,iVar1);
      this->fCurrentParent = this->fCurrentNode;
    }
    if (local_20 != (DOMNode *)0x0) {
      (*local_20->_vptr_DOMNode[0x2e])(local_20,1);
    }
  }
  return;
}

Assistant:

void AbstractDOMParser::endEntityReference(const XMLEntityDecl&)
{
    if (!fCreateEntityReferenceNodes)
      return;

    DOMEntityReferenceImpl *erImpl = 0;

    if (fCurrentParent->getNodeType() == DOMNode::ENTITY_REFERENCE_NODE)
        erImpl = (DOMEntityReferenceImpl *) fCurrentParent;

    fCurrentNode   = fCurrentParent;
    fCurrentParent = fCurrentNode->getParentNode ();

    // When the document is invalid but we continue parsing, we may
    // end up seeing more 'end' events than the 'start' ones.
    //
    if (fCurrentParent == 0 && fDocument != 0)
    {
      fCurrentNode = fDocument->getDocumentElement ();
      fCurrentParent = fCurrentNode;
    }

    if (erImpl)
        erImpl->setReadOnly(true, true);
}